

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_maputl.cpp
# Opt level: O1

int AF_AActor_RoughMonsterSearch
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  VMValue *pVVar1;
  PClass *pPVar2;
  int iVar3;
  undefined4 extraout_var;
  PClass *pPVar4;
  VMValue *pVVar5;
  AActor *pAVar6;
  char *pcVar7;
  bool bVar8;
  
  pPVar2 = AActor::RegistrationInfo.MyClass;
  if (numparam < 1) {
    pcVar7 = "(paramnum) < numparam";
  }
  else {
    if (((param->field_0).field_3.Type == '\x03') &&
       (((param->field_0).field_1.atag == 1 || ((param->field_0).field_1.a == (void *)0x0)))) {
      pAVar6 = (AActor *)(param->field_0).field_1.a;
      if (pAVar6 != (AActor *)0x0) {
        if ((pAVar6->super_DThinker).super_DObject.Class == (PClass *)0x0) {
          iVar3 = (**(pAVar6->super_DThinker).super_DObject._vptr_DObject)(pAVar6);
          (pAVar6->super_DThinker).super_DObject.Class = (PClass *)CONCAT44(extraout_var,iVar3);
        }
        pPVar4 = (pAVar6->super_DThinker).super_DObject.Class;
        bVar8 = pPVar4 != (PClass *)0x0;
        if (pPVar4 != pPVar2 && bVar8) {
          do {
            pPVar4 = pPVar4->ParentClass;
            bVar8 = pPVar4 != (PClass *)0x0;
            if (pPVar4 == pPVar2) break;
          } while (pPVar4 != (PClass *)0x0);
        }
        if (!bVar8) {
          pcVar7 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_0041d0fd;
        }
      }
      if (numparam == 1) {
        pcVar7 = "(paramnum) < numparam";
      }
      else {
        if (param[1].field_0.field_3.Type == '\0') {
          pVVar1 = param + 1;
          if (numparam < 3) {
            pVVar5 = defaultparam->Array;
            if (pVVar5[2].field_0.field_3.Type != '\0') {
              pcVar7 = "(defaultparam[paramnum]).Type == REGT_INT";
              goto LAB_0041d13b;
            }
          }
          else {
            pVVar5 = param;
            if (param[2].field_0.field_3.Type != '\0') {
              pcVar7 = "(param[paramnum]).Type == REGT_INT";
LAB_0041d13b:
              __assert_fail(pcVar7,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_maputl.cpp"
                            ,0x77c,
                            "int AF_AActor_RoughMonsterSearch(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                           );
            }
          }
          if (numparam < 4) {
            param = defaultparam->Array;
            if (param[3].field_0.field_3.Type == '\0') goto LAB_0041d06c;
            pcVar7 = "(defaultparam[paramnum]).Type == REGT_INT";
          }
          else {
            if (param[3].field_0.field_3.Type == '\0') {
LAB_0041d06c:
              pAVar6 = P_RoughMonsterSearch
                                 (pAVar6,(pVVar1->field_0).i,pVVar5[2].field_0.i != 0,
                                  param[3].field_0.i != 0);
              if (numret < 1) {
                iVar3 = 0;
              }
              else {
                if (ret == (VMReturn *)0x0) {
                  __assert_fail("ret != NULL",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_maputl.cpp"
                                ,0x77e,
                                "int AF_AActor_RoughMonsterSearch(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                               );
                }
                iVar3 = 1;
                VMReturn::SetPointer(ret,pAVar6,1);
              }
              return iVar3;
            }
            pcVar7 = "(param[paramnum]).Type == REGT_INT";
          }
          __assert_fail(pcVar7,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_maputl.cpp"
                        ,0x77d,
                        "int AF_AActor_RoughMonsterSearch(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                       );
        }
        pcVar7 = "param[paramnum].Type == REGT_INT";
      }
      __assert_fail(pcVar7,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_maputl.cpp"
                    ,0x77b,
                    "int AF_AActor_RoughMonsterSearch(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    pcVar7 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
  }
LAB_0041d0fd:
  __assert_fail(pcVar7,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_maputl.cpp"
                ,0x77a,
                "int AF_AActor_RoughMonsterSearch(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
               );
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, RoughMonsterSearch)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_INT(distance);
	PARAM_BOOL_DEF(onlyseekable);
	PARAM_BOOL_DEF(frontonly);
	ACTION_RETURN_OBJECT(P_RoughMonsterSearch(self, distance, onlyseekable, frontonly));
}